

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O0

bool __thiscall
ON_Leader::Create(ON_Leader *this,wchar_t *leader_text,ON_DimStyle *dimstyle,int point_count,
                 ON_3dPoint *points,ON_Plane *plane,bool bWrapped,double rect_width)

{
  ON_DimStyle *RtfString;
  AnnotationType annotation_type;
  bool bVar1;
  ON_TextContent *this_00;
  ON_TextContent *local_f0;
  ON_TextContent *text;
  ON_Plane local_d8;
  double local_50;
  double rect_width_local;
  ON_Plane *pOStack_40;
  bool bWrapped_local;
  ON_Plane *plane_local;
  ON_3dPoint *points_local;
  ON_DimStyle *pOStack_28;
  int point_count_local;
  ON_DimStyle *dimstyle_local;
  wchar_t *leader_text_local;
  ON_Leader *this_local;
  
  rect_width_local._7_1_ = bWrapped;
  if (point_count < 2) {
    this_local._7_1_ = false;
  }
  else {
    local_50 = rect_width;
    pOStack_40 = plane;
    plane_local = (ON_Plane *)points;
    points_local._4_4_ = point_count;
    pOStack_28 = dimstyle;
    dimstyle_local = (ON_DimStyle *)leader_text;
    leader_text_local = (wchar_t *)this;
    InvalidateTextPoint(this);
    pOStack_28 = ON_DimStyle::DimStyleOrDefault(pOStack_28);
    ON_Annotation::SetDimensionStyleId(&this->super_ON_Annotation,pOStack_28);
    local_d8.plane_equation.z = (pOStack_40->plane_equation).z;
    local_d8.plane_equation.d = (pOStack_40->plane_equation).d;
    local_d8.plane_equation.x = (pOStack_40->plane_equation).x;
    local_d8.plane_equation.y = (pOStack_40->plane_equation).y;
    local_d8.zaxis.y = (pOStack_40->zaxis).y;
    local_d8.zaxis.z = (pOStack_40->zaxis).z;
    local_d8.yaxis.z = (pOStack_40->yaxis).z;
    local_d8.zaxis.x = (pOStack_40->zaxis).x;
    local_d8.origin.x = (pOStack_40->origin).x;
    local_d8.origin.y = (pOStack_40->origin).y;
    local_d8.origin.z = (pOStack_40->origin).z;
    local_d8.xaxis.x = (pOStack_40->xaxis).x;
    local_d8.xaxis.y = (pOStack_40->xaxis).y;
    local_d8.xaxis.z = (pOStack_40->xaxis).z;
    local_d8.yaxis.x = (pOStack_40->yaxis).x;
    local_d8.yaxis.y = (pOStack_40->yaxis).y;
    SetPlane(this,&local_d8);
    ON_Plane::~ON_Plane(&local_d8);
    SetPoints3d(this,points_local._4_4_,&plane_local->origin);
    local_f0 = (ON_TextContent *)0x0;
    if (dimstyle_local != (ON_DimStyle *)0x0) {
      this_00 = (ON_TextContent *)operator_new(0xd8);
      ON_TextContent::ON_TextContent(this_00);
      RtfString = dimstyle_local;
      local_f0 = this_00;
      annotation_type = ON_Annotation::Type(&this->super_ON_Annotation);
      bVar1 = ON_TextContent::Create
                        (this_00,(wchar_t *)RtfString,annotation_type,pOStack_28,
                         (bool)(rect_width_local._7_1_ & 1),local_50,0.0);
      if (bVar1) {
        ON_Annotation::SetText(&this->super_ON_Annotation,&local_f0);
      }
      else if (local_f0 != (ON_TextContent *)0x0) {
        (*(local_f0->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Leader::Create(
  const wchar_t* leader_text,
  const ON_DimStyle* dimstyle,
  int point_count,
  const ON_3dPoint* points,
  const ON_Plane& plane,
  bool bWrapped,
  double rect_width
  )
{
  if (point_count < 2)
    return false;
  InvalidateTextPoint();
  
  dimstyle = &ON_DimStyle::DimStyleOrDefault(dimstyle);

  SetDimensionStyleId(*dimstyle);

  SetPlane(plane);
  SetPoints3d(point_count, points);

  ON_TextContent* text = nullptr;
  if (nullptr != leader_text)
  {
    text = new ON_TextContent;
    if (text->Create(leader_text, Type(), dimstyle, bWrapped, rect_width, 0.0))
      SetText(text);
    else
    {
      delete text;
      text = 0;
    }
  }

  return true;
}